

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_parse_fd_(ly_ctx *ctx,int fd,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  int iVar1;
  lyd_node *plVar2;
  char *format_00;
  LY_ERR no;
  size_t local_38;
  size_t length;
  char *data;
  
  if (ctx == (ly_ctx *)0x0 || fd == -1) {
    format_00 = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
  }
  else {
    iVar1 = lyp_mmap(ctx,fd,0,&local_38,(void **)&length);
    if (iVar1 == 0) {
      if (length != 0) {
        plVar2 = lyd_parse_data_(ctx,(char *)length,format,options,ap);
        lyp_munmap((void *)length,local_38);
        return plVar2;
      }
      return (lyd_node *)0x0;
    }
    format_00 = "Mapping file descriptor into memory failed (%s()).";
    no = LY_ESYS;
  }
  ly_log(ctx,LY_LLERR,no,format_00,"lyd_parse_fd_");
  return (lyd_node *)0x0;
}

Assistant:

static struct lyd_node *
lyd_parse_fd_(struct ly_ctx *ctx, int fd, LYD_FORMAT format, int options, va_list ap)
{
    struct lyd_node *ret;
    size_t length;
    char *data;

    if (!ctx || (fd == -1)) {
        LOGARG;
        return NULL;
    }

    if (lyp_mmap(ctx, fd, 0, &length, (void **)&data)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!data) {
        return NULL;
    }

    ret = lyd_parse_data_(ctx, data, format, options, ap);

    lyp_munmap(data, length);

    return ret;
}